

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_NicknameUUID.cpp
# Opt level: O0

string * calc_uuid_abi_cxx11_(string *__return_storage_ptr__,PlayerInfo *player)

{
  PlayerInfo *player_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,&player->name);
  return __return_storage_ptr__;
}

Assistant:

std::string calc_uuid(RenX::PlayerInfo &player)
{
	return player.name;
}